

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O2

void __thiscall AviWriter::setWord(AviWriter *this,uint filePosn,uint size)

{
  int64_t iVar1;
  ostream *poVar2;
  int *piVar3;
  AviWriter *this_00;
  
  iVar1 = SeekFile64(this,this->fOutFid,(ulong)filePosn,0);
  if (-1 < iVar1) {
    this_00 = this;
    addWord(this,size);
    iVar1 = SeekFile64(this_00,this->fOutFid,0,2);
    if (-1 < iVar1) {
      return;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"AVIFileSink::setWord(): SeekFile64 failed (err ");
  piVar3 = __errno_location();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
  std::operator<<(poVar2,")\n");
  return;
}

Assistant:

void AviWriter::setWord(unsigned filePosn, unsigned size) {
    do {
        if (SeekFile64(fOutFid, filePosn, SEEK_SET) < 0) break;
        addWord(size);
        if (SeekFile64(fOutFid, 0, SEEK_END) < 0) break; // go back to where we were

        return;
    } while (0);

    // One of the SeekFile64()s failed, probable because we're not a seekable file
    std::cerr << "AVIFileSink::setWord(): SeekFile64 failed (err " << errno << ")\n";
}